

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

bool __thiscall
OpenMesh::PolyConnectivity::is_simply_connected(PolyConnectivity *this,FaceHandle _fh)

{
  size_t *this_00;
  undefined1 *__k;
  iterator iVar1;
  bool bVar2;
  undefined1 local_78 [8];
  set<OpenMesh::FaceHandle,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
  nb_fhs;
  ConstFaceFaceIter cff_it;
  
  nb_fhs._M_t._M_impl._0_4_ = 0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&nb_fhs;
  nb_fhs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&nb_fhs;
  cff_iter((ConstFaceFaceIter *)&nb_fhs._M_t._M_impl.super__Rb_tree_header._M_node_count,this,_fh);
  this_00 = &nb_fhs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __k = &cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.field_0x14;
  while ((cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1 &&
         (((int)cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
           cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ ||
          (cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
           idx_ == 0))))) {
    cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         Iterators::
         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                      *)this_00);
    iVar1 = std::
            _Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
            ::find((_Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
                    *)local_78,(key_type *)__k);
    if (iVar1._M_node != (_Base_ptr)&nb_fhs) {
      bVar2 = false;
      goto LAB_001ad5a4;
    }
    cff_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
         Iterators::
         GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
         ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                      *)this_00);
    std::
    _Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
    ::_M_insert_unique<OpenMesh::FaceHandle>
              ((_Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
                *)local_78,(FaceHandle *)__k);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toOppositeFaceHandle>
                  *)this_00);
  }
  bVar2 = true;
LAB_001ad5a4:
  std::
  _Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
  ::~_Rb_tree((_Rb_tree<OpenMesh::FaceHandle,_OpenMesh::FaceHandle,_std::_Identity<OpenMesh::FaceHandle>,_std::less<OpenMesh::FaceHandle>,_std::allocator<OpenMesh::FaceHandle>_>
               *)local_78);
  return bVar2;
}

Assistant:

bool PolyConnectivity::is_simply_connected(FaceHandle _fh) const
{
  std::set<FaceHandle> nb_fhs;
  for (ConstFaceFaceIter cff_it = cff_iter(_fh); cff_it.is_valid(); ++cff_it)
  {
    if (nb_fhs.find(*cff_it) == nb_fhs.end())
    {
      nb_fhs.insert(*cff_it);
    }
    else
    {//there is more than one link
      return false;
    }
  }
  return true;
}